

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void run_container_grow(run_container_t *run,int32_t min,_Bool copy)

{
  rle16_t *prVar1;
  rle16_t *prVar2;
  int local_34;
  int local_30;
  int local_2c;
  rle16_t *oldruns;
  int32_t newCapacity;
  _Bool copy_local;
  int32_t min_local;
  run_container_t *run_local;
  
  if (run->capacity == 0) {
    local_2c = 0;
  }
  else {
    if (run->capacity < 0x40) {
      local_30 = run->capacity << 1;
    }
    else {
      if (run->capacity < 0x400) {
        local_34 = (run->capacity * 3) / 2;
      }
      else {
        local_34 = (run->capacity * 5) / 4;
      }
      local_30 = local_34;
    }
    local_2c = local_30;
  }
  oldruns._4_4_ = local_2c;
  if (local_2c < min) {
    oldruns._4_4_ = min;
  }
  run->capacity = oldruns._4_4_;
  if (run->capacity < min) {
    __assert_fail("run->capacity >= min",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x37aa,"void run_container_grow(run_container_t *, int32_t, _Bool)");
  }
  if (copy) {
    prVar2 = run->runs;
    prVar1 = (rle16_t *)realloc(prVar2,(long)run->capacity << 2);
    run->runs = prVar1;
    if (run->runs == (rle16_t *)0x0) {
      free(prVar2);
    }
  }
  else {
    if (run->runs != (rle16_t *)0x0) {
      free(run->runs);
    }
    prVar2 = (rle16_t *)malloc((long)run->capacity << 2);
    run->runs = prVar2;
  }
  if (run->runs == (rle16_t *)0x0) {
    fprintf(_stderr,"could not allocate memory\n");
  }
  if (run->runs == (rle16_t *)0x0) {
    __assert_fail("run->runs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x37bb,"void run_container_grow(run_container_t *, int32_t, _Bool)");
  }
  return;
}

Assistant:

void run_container_grow(run_container_t *run, int32_t min, bool copy) {
    int32_t newCapacity =
        (run->capacity == 0)
            ? RUN_DEFAULT_INIT_SIZE
            : run->capacity < 64 ? run->capacity * 2
                                 : run->capacity < 1024 ? run->capacity * 3 / 2
                                                        : run->capacity * 5 / 4;
    if (newCapacity < min) newCapacity = min;
    run->capacity = newCapacity;
    assert(run->capacity >= min);
    if (copy) {
        rle16_t *oldruns = run->runs;
        run->runs =
            (rle16_t *)realloc(oldruns, run->capacity * sizeof(rle16_t));
        if (run->runs == NULL) free(oldruns);
    } else {
        // Jon Strabala reports that some tools complain otherwise
        if (run->runs != NULL) {
          free(run->runs);
        }
        run->runs = (rle16_t *)malloc(run->capacity * sizeof(rle16_t));
    }
    // handle the case where realloc fails
    if (run->runs == NULL) {
      fprintf(stderr, "could not allocate memory\n");
    }
    assert(run->runs != NULL);
}